

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nth-derivative.h
# Opt level: O0

int32 __thiscall NthDerivativeCoder::Encode(NthDerivativeCoder *this,int32 k)

{
  int iVar1;
  int local_18;
  uint32 delta;
  int i;
  int32 k_local;
  NthDerivativeCoder *this_local;
  
  delta = k;
  for (local_18 = 0; local_18 < this->m_; local_18 = local_18 + 1) {
    iVar1 = this->memory_[local_18];
    this->memory_[local_18] = delta;
    delta = delta - iVar1;
  }
  if (this->m_ < this->n_) {
    iVar1 = this->m_;
    this->m_ = iVar1 + 1;
    this->memory_[iVar1] = delta;
  }
  return delta;
}

Assistant:

inline int32 NthDerivativeCoder::Encode(int32 k) {
  for (int i = 0; i < m_; ++i) {
    uint32 delta = static_cast<uint32>(k) - memory_[i];
    memory_[i] = k;
    k = delta;
  }
  if (m_ < n_)
    memory_[m_++] = k;
  return k;
}